

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_handle.c
# Opt level: O2

int log_handle_clear(log_handle handle)

{
  log_record plVar1;
  int iVar2;
  
  handle->count = 0;
  iVar2 = 0;
  if (handle->size != 0x100) {
    plVar1 = (log_record)realloc(handle->buffer,0x100);
    if (plVar1 == (log_record)0x0) {
      iVar2 = 1;
    }
    else {
      handle->buffer = plVar1;
      handle->size = 0x100;
    }
  }
  return iVar2;
}

Assistant:

int log_handle_clear(log_handle handle)
{
	handle->count = 0;

	if (handle->size != LOG_HANDLE_RECORD_SIZE_DEFAULT)
	{
		const size_t default_size = LOG_HANDLE_RECORD_SIZE_DEFAULT;

		register void *buffer = realloc(handle->buffer, default_size);

		if (buffer == NULL)
		{
			return 1;
		}

		handle->buffer = buffer;

		handle->size = default_size;
	}

	return 0;
}